

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmGeneratorTarget * __thiscall
cmGeneratorTarget::FindTargetToLink(cmGeneratorTarget *this,string *name)

{
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_00;
  ostream *poVar3;
  cmake *this_01;
  string local_1f0;
  cmListFileBacktrace local_1d0;
  ostringstream e;
  
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,name);
  if (this_00 != (cmGeneratorTarget *)0x0) {
    TVar2 = this_00->Target->TargetTypeValue;
    if (TVar2 == EXECUTABLE) {
      bVar1 = IsExecutableWithExports(this_00);
      if (!bVar1) {
        return (cmGeneratorTarget *)0x0;
      }
      TVar2 = this_00->Target->TargetTypeValue;
    }
    if (TVar2 != OBJECT_LIBRARY) {
      return this_00;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,"Target \"");
    poVar3 = std::operator<<(poVar3,(string *)&this->Target->Name);
    poVar3 = std::operator<<(poVar3,"\" links to OBJECT library \"");
    poVar3 = std::operator<<(poVar3,(string *)&this_00->Target->Name);
    std::operator<<(poVar3,
                    "\" but this is not allowed.  One may link only to STATIC or SHARED libraries, or to executables with the ENABLE_EXPORTS property set."
                   );
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    std::__cxx11::stringbuf::str();
    GetBacktrace(&local_1d0,this);
    cmake::IssueMessage(this_01,FATAL_ERROR,&local_1f0,&local_1d0,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return (cmGeneratorTarget *)0x0;
}

Assistant:

cmGeneratorTarget*
cmGeneratorTarget::FindTargetToLink(std::string const& name) const
{
  cmGeneratorTarget* tgt =
      this->LocalGenerator->FindGeneratorTargetToUse(name);

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if(tgt && tgt->GetType() == cmState::EXECUTABLE &&
     !tgt->IsExecutableWithExports())
    {
    tgt = 0;
    }

  if(tgt && tgt->GetType() == cmState::OBJECT_LIBRARY)
    {
    std::ostringstream e;
    e << "Target \"" << this->GetName() << "\" links to "
      "OBJECT library \"" << tgt->GetName() << "\" but this is not "
      "allowed.  "
      "One may link only to STATIC or SHARED libraries, or to executables "
      "with the ENABLE_EXPORTS property set.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(cmake::FATAL_ERROR, e.str(),
                     this->GetBacktrace());
    tgt = 0;
    }

  return tgt;
}